

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

int IDARootInit(void *ida_mem,int nrtfn,IDARootFn g)

{
  long lVar1;
  uint uVar2;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  void *pvVar3;
  int line;
  ulong uVar4;
  int error_code;
  char *msgfmt;
  uint uVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    ida_mem = (IDAMem)0x0;
    line = 0x8d2;
  }
  else {
    uVar5 = 0;
    if (0 < nrtfn) {
      uVar5 = nrtfn;
    }
    uVar2 = *(uint *)((long)ida_mem + 0x780);
    if (0 < (int)uVar2 && uVar5 != uVar2) {
      free(*(void **)((long)ida_mem + 0x7b0));
      *(undefined8 *)((long)ida_mem + 0x7b0) = 0;
      free(*(void **)((long)ida_mem + 0x7b8));
      *(undefined8 *)((long)ida_mem + 0x7b8) = 0;
      free(*(void **)((long)ida_mem + 0x7c0));
      *(undefined8 *)((long)ida_mem + 0x7c0) = 0;
      free(*(void **)((long)ida_mem + 0x788));
      *(undefined8 *)((long)ida_mem + 0x788) = 0;
      free(*(void **)((long)ida_mem + 0x790));
      *(undefined8 *)((long)ida_mem + 0x790) = 0;
      free(*(void **)((long)ida_mem + 0x7e8));
      *(undefined8 *)((long)ida_mem + 0x7e8) = 0;
      uVar2 = *(uint *)((long)ida_mem + 0x780);
      lVar1 = (long)(int)uVar2 * 3;
      auVar7._8_4_ = (int)lVar1;
      auVar7._0_8_ = lVar1;
      auVar7._12_4_ = (int)((ulong)lVar1 >> 0x20);
      *(long *)((long)ida_mem + 0x678) = *(long *)((long)ida_mem + 0x678) + (long)(int)uVar2 * -3;
      *(long *)((long)ida_mem + 0x680) = *(long *)((long)ida_mem + 0x680) - auVar7._8_8_;
    }
    if (nrtfn < 1) {
      *(undefined4 *)((long)ida_mem + 0x780) = 0;
      *(undefined8 *)((long)ida_mem + 0x778) = 0;
      return 0;
    }
    if (uVar5 == uVar2) {
      if (*(IDARootFn *)((long)ida_mem + 0x778) == g) {
        return 0;
      }
      if (g != (IDARootFn)0x0) {
        *(IDARootFn *)((long)ida_mem + 0x778) = g;
        return 0;
      }
      free(*(void **)((long)ida_mem + 0x7b0));
      *(undefined8 *)((long)ida_mem + 0x7b0) = 0;
      free(*(void **)((long)ida_mem + 0x7b8));
      *(undefined8 *)((long)ida_mem + 0x7b8) = 0;
      free(*(void **)((long)ida_mem + 0x7c0));
      *(undefined8 *)((long)ida_mem + 0x7c0) = 0;
      free(*(void **)((long)ida_mem + 0x788));
      *(undefined8 *)((long)ida_mem + 0x788) = 0;
      free(*(void **)((long)ida_mem + 0x790));
      *(undefined8 *)((long)ida_mem + 0x790) = 0;
      free(*(void **)((long)ida_mem + 0x7e8));
      *(undefined8 *)((long)ida_mem + 0x7e8) = 0;
      *(ulong *)((long)ida_mem + 0x678) = *(long *)((long)ida_mem + 0x678) - (ulong)(uVar5 * 3);
      *(ulong *)((long)ida_mem + 0x680) = *(long *)((long)ida_mem + 0x680) - (ulong)(uVar5 * 3);
      msgfmt = "g = NULL illegal.";
      error_code = -0x16;
      line = 0x916;
    }
    else {
      *(uint *)((long)ida_mem + 0x780) = uVar5;
      if (g == (IDARootFn)0x0) {
        msgfmt = "g = NULL illegal.";
        error_code = -0x16;
        line = 0x92d;
      }
      else {
        *(IDARootFn *)((long)ida_mem + 0x778) = g;
        sVar6 = (ulong)uVar5 * 8;
        __ptr = malloc(sVar6);
        *(void **)((long)ida_mem + 0x7b0) = __ptr;
        if (__ptr == (void *)0x0) {
          msgfmt = "A memory request failed.";
          error_code = -0x15;
          line = 0x939;
        }
        else {
          __ptr_00 = malloc(sVar6);
          *(void **)((long)ida_mem + 0x7b8) = __ptr_00;
          if (__ptr_00 == (void *)0x0) {
            free(__ptr);
            *(undefined8 *)((long)ida_mem + 0x7b0) = 0;
            msgfmt = "A memory request failed.";
            error_code = -0x15;
            line = 0x945;
          }
          else {
            __ptr_01 = malloc(sVar6);
            *(void **)((long)ida_mem + 0x7c0) = __ptr_01;
            if (__ptr_01 == (void *)0x0) {
              free(__ptr);
              *(undefined8 *)((long)ida_mem + 0x7b0) = 0;
              free(__ptr_00);
              *(undefined8 *)((long)ida_mem + 0x7b8) = 0;
              msgfmt = "A memory request failed.";
              error_code = -0x15;
              line = 0x953;
            }
            else {
              sVar6 = (ulong)uVar5 << 2;
              __ptr_02 = malloc(sVar6);
              *(void **)((long)ida_mem + 0x788) = __ptr_02;
              if (__ptr_02 == (void *)0x0) {
                free(__ptr);
                *(undefined8 *)((long)ida_mem + 0x7b0) = 0;
                free(__ptr_00);
                *(undefined8 *)((long)ida_mem + 0x7b8) = 0;
                free(__ptr_01);
                *(undefined8 *)((long)ida_mem + 0x7c0) = 0;
                msgfmt = "A memory request failed.";
                error_code = -0x15;
                line = 0x963;
              }
              else {
                __ptr_03 = malloc(sVar6);
                *(void **)((long)ida_mem + 0x790) = __ptr_03;
                if (__ptr_03 == (void *)0x0) {
                  free(__ptr);
                  *(undefined8 *)((long)ida_mem + 0x7b0) = 0;
                  free(__ptr_00);
                  *(undefined8 *)((long)ida_mem + 0x7b8) = 0;
                  free(__ptr_01);
                  *(undefined8 *)((long)ida_mem + 0x7c0) = 0;
                  free(__ptr_02);
                  *(undefined8 *)((long)ida_mem + 0x788) = 0;
                  msgfmt = "A memory request failed.";
                  error_code = -0x15;
                  line = 0x975;
                }
                else {
                  pvVar3 = malloc(sVar6);
                  *(void **)((long)ida_mem + 0x7e8) = pvVar3;
                  if (pvVar3 != (void *)0x0) {
                    for (uVar4 = 0; (uint)nrtfn != uVar4; uVar4 = uVar4 + 1) {
                      *(undefined4 *)((long)__ptr_03 + uVar4 * 4) = 0;
                    }
                    for (uVar4 = 0; (uint)nrtfn != uVar4; uVar4 = uVar4 + 1) {
                      *(undefined4 *)((long)pvVar3 + uVar4 * 4) = 1;
                    }
                    *(ulong *)((long)ida_mem + 0x678) =
                         (ulong)(uVar5 * 3) + *(long *)((long)ida_mem + 0x678);
                    *(ulong *)((long)ida_mem + 0x680) =
                         (ulong)(uVar5 * 3) + *(long *)((long)ida_mem + 0x680);
                    return 0;
                  }
                  free(__ptr);
                  *(undefined8 *)((long)ida_mem + 0x7b0) = 0;
                  free(__ptr_00);
                  *(undefined8 *)((long)ida_mem + 0x7b8) = 0;
                  free(__ptr_01);
                  *(undefined8 *)((long)ida_mem + 0x7c0) = 0;
                  free(__ptr_02);
                  *(undefined8 *)((long)ida_mem + 0x788) = 0;
                  free(__ptr_03);
                  *(undefined8 *)((long)ida_mem + 0x790) = 0;
                  msgfmt = "A memory request failed.";
                  error_code = -0x15;
                  line = 0x989;
                }
              }
            }
          }
        }
      }
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDARootInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDARootInit(void* ida_mem, int nrtfn, IDARootFn g)
{
  IDAMem IDA_mem;
  int i, nrt;

  /* Check ida_mem pointer */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If rerunning IDARootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != IDA_mem->ida_nrtfn) && (IDA_mem->ida_nrtfn > 0))
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    free(IDA_mem->ida_rootdir);
    IDA_mem->ida_rootdir = NULL;
    free(IDA_mem->ida_gactive);
    IDA_mem->ida_gactive = NULL;

    IDA_mem->ida_lrw -= 3 * (IDA_mem->ida_nrtfn);
    IDA_mem->ida_liw -= 3 * (IDA_mem->ida_nrtfn);
  }

  /* If IDARootInit() was called with nrtfn == 0, then set ida_nrtfn to
     zero and ida_gfun to NULL before returning */
  if (nrt == 0)
  {
    IDA_mem->ida_nrtfn = nrt;
    IDA_mem->ida_gfun  = NULL;
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_SUCCESS);
  }

  /* If rerunning IDARootInit() with the same number of root functions
     (not changing number of gfun components), then check if the root
     function argument has changed */
  /* If g != NULL then return as currently reserved memory resources
     will suffice */
  if (nrt == IDA_mem->ida_nrtfn)
  {
    if (g != IDA_mem->ida_gfun)
    {
      if (g == NULL)
      {
        free(IDA_mem->ida_glo);
        IDA_mem->ida_glo = NULL;
        free(IDA_mem->ida_ghi);
        IDA_mem->ida_ghi = NULL;
        free(IDA_mem->ida_grout);
        IDA_mem->ida_grout = NULL;
        free(IDA_mem->ida_iroots);
        IDA_mem->ida_iroots = NULL;
        free(IDA_mem->ida_rootdir);
        IDA_mem->ida_rootdir = NULL;
        free(IDA_mem->ida_gactive);
        IDA_mem->ida_gactive = NULL;

        IDA_mem->ida_lrw -= 3 * nrt;
        IDA_mem->ida_liw -= 3 * nrt;

        IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ROOT_FUNC_NULL);
        SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
        return (IDA_ILL_INPUT);
      }
      else
      {
        IDA_mem->ida_gfun = g;
        SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
        return (IDA_SUCCESS);
      }
    }
    else
    {
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_SUCCESS);
    }
  }

  /* Set variable values in IDA memory block */
  IDA_mem->ida_nrtfn = nrt;
  if (g == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ROOT_FUNC_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  else { IDA_mem->ida_gfun = g; }

  /* Allocate necessary memory and return */
  IDA_mem->ida_glo = NULL;
  IDA_mem->ida_glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (IDA_mem->ida_glo == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_ghi = NULL;
  IDA_mem->ida_ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (IDA_mem->ida_ghi == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_grout = NULL;
  IDA_mem->ida_grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (IDA_mem->ida_grout == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_iroots = NULL;
  IDA_mem->ida_iroots = (int*)malloc(nrt * sizeof(int));
  if (IDA_mem->ida_iroots == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_rootdir = NULL;
  IDA_mem->ida_rootdir = (int*)malloc(nrt * sizeof(int));
  if (IDA_mem->ida_rootdir == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_gactive = NULL;
  IDA_mem->ida_gactive = (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (IDA_mem->ida_gactive == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    free(IDA_mem->ida_rootdir);
    IDA_mem->ida_rootdir = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { IDA_mem->ida_rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { IDA_mem->ida_gactive[i] = SUNTRUE; }

  IDA_mem->ida_lrw += 3 * nrt;
  IDA_mem->ida_liw += 3 * nrt;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}